

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_identifier.h
# Opt level: O0

flatbuffers_thash_t flatbuffers_type_hash_from_string(char *identifier)

{
  uint8_t *p;
  flatbuffers_thash_t h;
  char *identifier_local;
  
  if (*identifier == '\0') {
    identifier_local._4_4_ = 0;
  }
  else {
    identifier_local._4_4_ = (uint)(byte)*identifier;
    if ((identifier[1] != '\0') &&
       (identifier_local._4_4_ = (uint)(byte)identifier[1] * 0x100 + identifier_local._4_4_,
       identifier[2] != '\0')) {
      identifier_local._4_4_ =
           (uint)(byte)identifier[3] * 0x1000000 +
           (uint)(byte)identifier[2] * 0x10000 + identifier_local._4_4_;
    }
  }
  return identifier_local._4_4_;
}

Assistant:

static inline flatbuffers_thash_t flatbuffers_type_hash_from_string(const char *identifier)
{
    flatbuffers_thash_t h = 0;
    const uint8_t *p = (const uint8_t *)identifier;

    if (!p[0]) return h;
    h += ((flatbuffers_thash_t)p[0]);
    if (!p[1]) return h;
    h += ((flatbuffers_thash_t)p[1]) << 8;
    if (!p[2]) return h;
    h += ((flatbuffers_thash_t)p[2]) << 16;
    /* No need to test for termination here. */
    h += ((flatbuffers_thash_t)p[3]) << 24;
    return h;
}